

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_stats(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  REF_INT extrapolate;
  REF_DBL min_bary;
  REF_DBL max_error;
  uint local_38;
  uint local_34;
  REF_DBL local_30;
  REF_DBL local_28;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  local_38 = 0;
  if (ref_mpi->id == 0) {
    if (0 < ref_interp->n_tree) {
      printf("tree search: %d found, %.2f avg cells\n",
             (double)ref_interp->tree_cells / (double)ref_interp->n_tree);
    }
    uVar3 = ref_interp->n_walk;
    if ((0 < (int)uVar3) || (0 < ref_interp->n_terminated)) {
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             (double)ref_interp->walk_steps / (double)(int)uVar3,(ulong)uVar3,
             (ulong)(uint)ref_interp->n_terminated);
    }
    printf("geom nodes: %d failed, %d successful\n",(ulong)(uint)ref_interp->n_geom_fail,
           (ulong)(uint)ref_interp->n_geom);
  }
  if (0 < pRVar1->max) {
    lVar4 = 0;
    lVar5 = 0;
    uVar3 = local_38;
    do {
      if ((-1 < *(long *)((long)pRVar1->global + lVar4 * 2)) &&
         (pRVar1->ref_mpi->id == *(int *)((long)pRVar1->part + lVar4))) {
        pRVar2 = ref_interp->bary;
        dVar7 = pRVar2[lVar4];
        if (pRVar2[lVar4 + 1] <= pRVar2[lVar4]) {
          dVar7 = pRVar2[lVar4 + 1];
        }
        dVar6 = pRVar2[lVar4 + 2];
        if (pRVar2[lVar4 + 3] <= pRVar2[lVar4 + 2]) {
          dVar6 = pRVar2[lVar4 + 3];
        }
        if (dVar7 < dVar6) {
          dVar6 = pRVar2[lVar4];
          if (pRVar2[lVar4 + 1] <= pRVar2[lVar4]) {
            dVar6 = pRVar2[lVar4 + 1];
          }
        }
        if (dVar6 < ref_interp->inside) {
          uVar3 = uVar3 + 1;
          local_38 = uVar3;
        }
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 < pRVar1->max);
  }
  local_34 = local_38;
  uVar3 = ref_mpi_sum(ref_mpi,&local_34,&local_38,1,1);
  if (uVar3 == 0) {
    uVar3 = ref_interp_max_error(ref_interp,&local_28);
    if (uVar3 == 0) {
      uVar3 = ref_interp_min_bary(ref_interp,&local_30);
      if (uVar3 == 0) {
        uVar3 = 0;
        if (ref_mpi->id == 0) {
          printf("interp min bary %e max error %e extrap %d\n",local_30,local_28,(ulong)local_38);
          uVar3 = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x9c8,"ref_interp_stats",(ulong)uVar3,"mb");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x9c7,"ref_interp_stats",(ulong)uVar3,"me");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x9c5,
           "ref_interp_stats",(ulong)uVar3,"sum");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_interp_stats(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT extrapolate = 0;
  REF_INT node;
  REF_DBL this_bary, max_error, min_bary;

  if (ref_mpi_once(ref_mpi)) {
    if (ref_interp->n_tree > 0)
      printf("tree search: %d found, %.2f avg cells\n", ref_interp->n_tree,
             (REF_DBL)ref_interp->tree_cells / (REF_DBL)ref_interp->n_tree);
    if (ref_interp->n_walk > 0 || ref_interp->n_terminated > 0)
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             ref_interp->n_walk,
             (REF_DBL)ref_interp->walk_steps / (REF_DBL)ref_interp->n_walk,
             ref_interp->n_terminated);
    printf("geom nodes: %d failed, %d successful\n", ref_interp->n_geom_fail,
           ref_interp->n_geom);
  }

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    this_bary = MIN(
        MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
        MIN(ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]));
    if (this_bary < ref_interp->inside) extrapolate++;
  }
  node = extrapolate;
  RSS(ref_mpi_sum(ref_mpi, &node, &extrapolate, 1, REF_INT_TYPE), "sum");

  RSS(ref_interp_max_error(ref_interp, &max_error), "me");
  RSS(ref_interp_min_bary(ref_interp, &min_bary), "mb");

  if (ref_mpi_once(ref_mpi)) {
    printf("interp min bary %e max error %e extrap %d\n", min_bary, max_error,
           extrapolate);
  }

  return REF_SUCCESS;
}